

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O3

void __thiscall
BlindFactor_Constractor_Test::~BlindFactor_Constractor_Test(BlindFactor_Constractor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(BlindFactor, Constractor) {
  BlindFactor blind_factor;

  EXPECT_STREQ(
      blind_factor.GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(
      blind_factor.GetData().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_TRUE(blind_factor.IsEmpty());
}